

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_ModelComponent::SetModelSerialNumber
          (ON_ModelComponent *this,uint model_serial_number,uint reference_model_serial_number,
          uint instance_definition_model_serial_number)

{
  bool bVar1;
  uint bit;
  uint instance_definition_model_serial_number_local;
  uint reference_model_serial_number_local;
  uint model_serial_number_local;
  ON_ModelComponent *this_local;
  
  bVar1 = (this->m_locked_status & 4) == 0;
  if (bVar1) {
    this->m_model_serial_number = model_serial_number;
    this->m_reference_model_serial_number = reference_model_serial_number;
    this->m_linked_idef_serial_number = instance_definition_model_serial_number;
    this->m_set_status = this->m_set_status | 4;
  }
  return bVar1;
}

Assistant:

bool ON_ModelComponent::SetModelSerialNumber(
  unsigned int model_serial_number,
  unsigned int reference_model_serial_number,
  unsigned int instance_definition_model_serial_number
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::ModelSerialNumberAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  m_model_serial_number = model_serial_number;
  m_reference_model_serial_number = reference_model_serial_number;
  m_linked_idef_serial_number = instance_definition_model_serial_number;
  m_set_status |= bit;
  return true;

}